

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

int MMDB_aget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,char **path)

{
  uint uVar1;
  uint32_t uVar2;
  MMDB_s *mmdb;
  char *__s;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  size_t __n;
  long lVar17;
  int iVar18;
  long lVar19;
  uint32_t uVar20;
  MMDB_entry_data_s key;
  char *first_invalid;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_16_11_285b1281_for_MMDB_entry_data_s_1 local_58;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  uint32_t uStack_3c;
  
  mmdb = start->mmdb;
  uVar20 = start->offset;
  entry_data->offset = 0;
  entry_data->offset_to_next = 0;
  entry_data->data_size = 0;
  entry_data->type = 0;
  (entry_data->field_1).utf8_string = (char *)0x0;
  *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
  *(undefined8 *)entry_data = 0;
  *(undefined8 *)&entry_data->field_0x8 = 0;
  iVar13 = decode_one_follow(mmdb,uVar20,entry_data);
  if (iVar13 == 0) {
    if (entry_data->has_data == true) {
      iVar13 = 0;
      lVar17 = 0;
      while (__s = path[lVar17], __s != (char *)0x0) {
        lVar17 = lVar17 + 1;
        if (entry_data->type != 7) {
          if (entry_data->type == 0xb) {
            uVar1 = entry_data->data_size;
            piVar15 = __errno_location();
            iVar14 = *piVar15;
            *piVar15 = 0;
            uVar16 = strtol(__s,&first_invalid,10);
            iVar18 = *piVar15;
            *piVar15 = iVar14;
            if (iVar18 == 0x22) {
              iVar14 = 8;
              goto LAB_00102aef;
            }
            if ((((-1 < (long)uVar16) || (uVar16 = uVar16 + uVar1, -1 < (long)uVar16)) &&
                (*(char *)CONCAT44(first_invalid._4_4_,first_invalid._0_4_) == '\0')) &&
               (uVar16 < uVar1)) {
              lVar19 = uVar16 + 1;
              while (lVar19 = lVar19 + -1, lVar19 != 0) {
                iVar14 = decode_one(mmdb,entry_data->offset_to_next,entry_data);
                if ((iVar14 != 0) || (iVar14 = skip_map_or_array(mmdb,entry_data), iVar14 != 0))
                goto LAB_00102aef;
              }
              iVar14 = decode_one_follow(mmdb,entry_data->offset_to_next,&key);
              uVar3 = key._0_4_;
              uVar4 = key._4_4_;
              uVar5 = key._8_4_;
              uVar6 = key._12_4_;
              uVar7 = key.field_1.pointer;
              uVar8 = key.field_1.uint64._4_4_;
              uVar9 = key.field_1.uint128._8_4_;
              uVar10 = key.field_1.uint128._12_4_;
              uVar20 = key.offset;
              uVar2 = key.offset_to_next;
              uVar11 = key.data_size;
              uVar12 = key.type;
              goto joined_r0x00102a92;
            }
          }
LAB_00102ae8:
          iVar14 = 9;
LAB_00102aef:
          entry_data->offset = 0;
          entry_data->offset_to_next = 0;
          entry_data->data_size = 0;
          entry_data->type = 0;
          (entry_data->field_1).utf8_string = (char *)0x0;
          *(undefined8 *)((long)&entry_data->field_1 + 8) = 0;
          *(undefined8 *)entry_data = 0;
          *(undefined8 *)&entry_data->field_0x8 = 0;
          return iVar14;
        }
        uVar20 = entry_data->offset_to_next;
        uVar2 = entry_data->data_size;
        __n = strlen(__s);
        iVar18 = uVar2 + 1;
        while( true ) {
          iVar18 = iVar18 + -1;
          if (iVar18 == 0) goto LAB_00102ae8;
          iVar14 = decode_one_follow(mmdb,uVar20,&key);
          uVar20 = key.offset_to_next;
          if (iVar14 != 0) goto LAB_00102aef;
          if (key.type != 2) {
            iVar14 = 7;
            goto LAB_00102aef;
          }
          if ((__n == key.data_size) &&
             (iVar14 = bcmp(__s,(void *)CONCAT44(key.field_1.uint64._4_4_,key.field_1.pointer),__n),
             iVar14 == 0)) break;
          iVar14 = decode_one(mmdb,uVar20,(MMDB_entry_data_s *)&first_invalid);
          if ((iVar14 != 0) ||
             (iVar14 = skip_map_or_array(mmdb,(MMDB_entry_data_s *)&first_invalid),
             uVar20 = uStack_44, iVar14 != 0)) goto LAB_00102aef;
        }
        iVar14 = decode_one_follow(mmdb,uVar20,(MMDB_entry_data_s *)&first_invalid);
        uVar3 = first_invalid._0_4_;
        uVar4 = first_invalid._4_4_;
        uVar5 = uStack_60;
        uVar6 = uStack_5c;
        uVar7 = local_58.pointer;
        uVar8 = local_58.uint64._4_4_;
        uVar9 = local_58.uint128._8_4_;
        uVar10 = local_58.uint128._12_4_;
        uVar20 = local_48;
        uVar2 = uStack_44;
        uVar11 = uStack_40;
        uVar12 = uStack_3c;
joined_r0x00102a92:
        if (iVar14 != 0) goto LAB_00102aef;
        entry_data->offset = uVar20;
        entry_data->offset_to_next = uVar2;
        entry_data->data_size = uVar11;
        entry_data->type = uVar12;
        (entry_data->field_1).pointer = uVar7;
        *(undefined4 *)((long)&entry_data->field_1 + 4) = uVar8;
        *(undefined4 *)((long)&entry_data->field_1 + 8) = uVar9;
        *(undefined4 *)((long)&entry_data->field_1 + 0xc) = uVar10;
        entry_data->has_data = SUB41(uVar3,0);
        *(int3 *)&entry_data->field_0x1 = SUB43(uVar3,1);
        *(undefined4 *)&entry_data->field_0x4 = uVar4;
        *(undefined4 *)&entry_data->field_0x8 = uVar5;
        *(undefined4 *)&entry_data->field_0xc = uVar6;
      }
    }
    else {
      iVar13 = 8;
    }
  }
  return iVar13;
}

Assistant:

int MMDB_aget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    const char *const *const path) {
    const MMDB_s *const mmdb = start->mmdb;
    uint32_t offset = start->offset;

    memset(entry_data, 0, sizeof(MMDB_entry_data_s));
    DEBUG_NL;
    DEBUG_MSG("looking up value by path");

    CHECKED_DECODE_ONE_FOLLOW(mmdb, offset, entry_data);

    DEBUG_NL;
    DEBUG_MSGF("top level element is a %s", type_num_to_name(entry_data->type));

    /* Can this happen? It'd probably represent a pathological case under
     * normal use, but there's nothing preventing someone from passing an
     * invalid MMDB_entry_s struct to this function */
    if (!entry_data->has_data) {
        return MMDB_INVALID_LOOKUP_PATH_ERROR;
    }

    const char *path_elem;
    int i = 0;
    while (NULL != (path_elem = path[i++])) {
        DEBUG_NL;
        DEBUG_MSGF("path elem = %s", path_elem);

        /* XXX - it'd be good to find a quicker way to skip through these
           entries that doesn't involve decoding them
           completely. Basically we need to just use the size from the
           control byte to advance our pointer rather than calling
           decode_one(). */
        if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
            int status = lookup_path_in_array(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else if (entry_data->type == MMDB_DATA_TYPE_MAP) {
            int status = lookup_path_in_map(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else {
            /* Once we make the code traverse maps & arrays without calling
             * decode_one() we can get rid of this. */
            memset(entry_data, 0, sizeof(MMDB_entry_data_s));
            return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
        }
    }

    return MMDB_SUCCESS;
}